

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpsrv.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPServer::getp_shutdown
          (CVmObjHTTPServer *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  vm_httpsrv_ext *pvVar4;
  TadsListenerThread *pTVar5;
  int *in_RCX;
  int __how;
  CVmRefCntObj *in_RDX;
  CVmObjHTTPServer *in_RDI;
  vm_httpsrv_ext *ext;
  int wait;
  uint argc;
  CVmNativeCodeDesc *in_stack_ffffffffffffff98;
  uint *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int local_40;
  
  if (in_RCX == (int *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = *in_RCX;
  }
  iVar2 = iVar3;
  if ((getp_shutdown(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_shutdown(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_shutdown::desc,0,1);
    __cxa_guard_release(&getp_shutdown(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = (int)in_RCX;
  iVar2 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0
                     ,in_stack_ffffffffffffff98);
  if (iVar2 == 0) {
    local_40 = 0;
    if (iVar3 != 0) {
      local_40 = CVmBif::pop_bool_val();
    }
    pvVar4 = get_ext(in_RDI);
    if ((pvVar4 == (vm_httpsrv_ext *)0x0) || (pvVar4->l == (TadsListener *)0x0)) {
      vm_val_t::set_true((vm_val_t *)in_RDX);
    }
    else {
      CVmRefCntObj::add_ref((CVmRefCntObj *)0x25c413);
      TadsListener::shutdown(pvVar4->l,iVar1,__how);
      if (local_40 != 0) {
        pTVar5 = TadsListener::get_thread(pvVar4->l);
        OS_Waitable::wait(&(pTVar5->super_OS_Thread).super_OS_Waitable,(void *)0xffffffffffffffff);
      }
      TadsListener::get_thread(pvVar4->l);
      iVar3 = OS_Waitable::test((OS_Waitable *)0x25c46a);
      vm_val_t::set_logical((vm_val_t *)in_RDX,iVar3);
      CVmRefCntObj::release_ref(in_RDX);
    }
  }
  return 1;
}

Assistant:

int CVmObjHTTPServer::getp_shutdown(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* check arguments */
    int wait = FALSE;
    if (argc >= 1)
        wait = CVmBif::pop_bool_val(vmg0_);

    /* if we have a listener, tell it to shut down */
    vm_httpsrv_ext *ext = get_ext();
    if (ext != 0 && ext->l != 0)
    {
        /* add a reference on the listener while we're using it */
        ext->l->add_ref();
        
        /* shut down the server */
        ext->l->shutdown();

        /* if we're waiting, wait for the listener thread to exit */
        if (wait)
            ext->l->get_thread()->wait();

        /* 
         *   Return true if the thread is done, nil if it's still running.
         *   The main listener thread waits for all of its launched server
         *   threads to exit before it itself exits, so once the listener
         *   thread is done, we can be sure that all of its launched threads
         *   are done as well. 
         */
        retval->set_logical(ext->l->get_thread()->test());

        /* done with the listener */
        ext->l->release_ref();
    }
    else
    {
        /* there is no server, so it's already shut down */
        retval->set_true();
    }

    /* handled */
    return TRUE;
}